

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeProperty.cpp
# Opt level: O0

String * Rml::GetFontFaceDescription
                   (String *__return_storage_ptr__,String *font_family,FontStyle style,
                   FontWeight weight)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  String local_d8;
  uint local_b4;
  String local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_40 [8];
  String font_attributes;
  FontWeight weight_local;
  FontStyle style_local;
  String *font_family_local;
  
  font_attributes.field_2._12_2_ = weight;
  font_attributes.field_2._M_local_buf[0xf] = style;
  ::std::__cxx11::string::string(local_40);
  if (font_attributes.field_2._M_local_buf[0xf] == '\x01') {
    ::std::__cxx11::string::operator+=(local_40,"italic, ");
  }
  if (font_attributes.field_2._12_2_ == 700) {
    ::std::__cxx11::string::operator+=(local_40,"bold, ");
  }
  else if ((font_attributes.field_2._12_2_ != 0) && (font_attributes.field_2._12_2_ != 400)) {
    local_b4 = (uint)(ushort)font_attributes.field_2._12_2_;
    ::std::__cxx11::string::string((string *)&local_d8);
    ToString<int>(&local_b0,(int *)&local_b4,&local_d8);
    ::std::operator+(&local_90,"weight=",&local_b0);
    ::std::operator+(&local_70,&local_90,", ");
    ::std::__cxx11::string::operator+=(local_40,(string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_b0);
    ::std::__cxx11::string::~string((string *)&local_d8);
  }
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    ::std::__cxx11::string::size();
    ::std::__cxx11::string::resize((ulong)local_40);
  }
  else {
    ::std::__cxx11::string::operator=(local_40,"regular");
  }
  uVar2 = ::std::__cxx11::string::c_str();
  uVar3 = ::std::__cxx11::string::c_str();
  CreateString_abi_cxx11_(__return_storage_ptr__,"\'%s\' [%s]",uVar2,uVar3);
  ::std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

String GetFontFaceDescription(const String& font_family, Style::FontStyle style, Style::FontWeight weight)
{
	String font_attributes;

	if (style == Style::FontStyle::Italic)
		font_attributes += "italic, ";
	if (weight == Style::FontWeight::Bold)
		font_attributes += "bold, ";
	else if (weight != Style::FontWeight::Auto && weight != Style::FontWeight::Normal)
		font_attributes += "weight=" + ToString((int)weight) + ", ";

	if (font_attributes.empty())
		font_attributes = "regular";
	else
		font_attributes.resize(font_attributes.size() - 2);

	return CreateString("'%s' [%s]", font_family.c_str(), font_attributes.c_str());
}